

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * cmsys::SystemTools::JoinPath
                   (string *__return_storage_ptr__,const_iterator first,const_iterator last)

{
  const_iterator cVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar1._M_current = first._M_current;
  if (first._M_current != last._M_current) {
    do {
      cVar1._M_current = cVar1._M_current + 1;
    } while (cVar1._M_current != last._M_current);
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (first._M_current != last._M_current) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)((first._M_current)->_M_dataplus)._M_p);
    first._M_current = first._M_current + 1;
  }
  if (first._M_current != last._M_current) {
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)((first._M_current)->_M_dataplus)._M_p);
    first._M_current = first._M_current + 1;
  }
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)((first._M_current)->_M_dataplus)._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::JoinPath(
  std::vector<std::string>::const_iterator first,
  std::vector<std::string>::const_iterator last)
{
  // Construct result in a single string.
  std::string result;
  size_t len = 0;
  std::vector<std::string>::const_iterator i;
  for (i = first; i != last; ++i) {
    len += 1 + i->size();
  }
  result.reserve(len);

  // The first two components do not add a slash.
  if (first != last) {
    result.append(*first++);
  }
  if (first != last) {
    result.append(*first++);
  }

  // All remaining components are always separated with a slash.
  while (first != last) {
    result.append("/");
    result.append((*first++));
  }

  // Return the concatenated result.
  return result;
}